

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void __thiscall sf2cute::SoundFont::ClearSamples(SoundFont *this)

{
  bool bVar1;
  __shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  shared_ptr<sf2cute::SFSample> *sample;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
  *__range1;
  SoundFont *this_local;
  
  __end1 = std::
           vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
           ::begin(&this->samples_);
  sample = (shared_ptr<sf2cute::SFSample> *)
           std::
           vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
           ::end(&this->samples_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<sf2cute::SFSample>_*,_std::vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>_>
                                *)&sample);
    if (!bVar1) break;
    this_00 = (__shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<sf2cute::SFSample>_*,_std::vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>_>
              ::operator*(&__end1);
    this_01 = std::__shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_00);
    SFSample::reset_parent_file(this_01);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<sf2cute::SFSample>_*,_std::vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>::
  clear(&this->samples_);
  return;
}

Assistant:

void SoundFont::ClearSamples() noexcept {
  for (const auto & sample : samples_) {
    sample->reset_parent_file();
  }
  samples_.clear();
}